

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O2

AssertionResult * __thiscall
iutest::detail::PropertyMatcher<int((anonymous_namespace)::X::*)()const,int>::operator()
          (AssertionResult *__return_storage_ptr__,
          PropertyMatcher<int((anonymous_namespace)::X::*)()const,int> *this,X *actual)

{
  code *pcVar1;
  AssertionResult *rhs;
  int local_6c;
  string local_68;
  AssertionResult local_48;
  
  local_68._M_string_length = (size_type)(this + 0x10);
  local_68._M_dataplus._M_p = (pointer)&PTR__IMatcher_00224340;
  pcVar1 = (code *)**(ulong **)(this + 8);
  if (((ulong)pcVar1 & 1) != 0) {
    pcVar1 = *(code **)(pcVar1 + *(long *)((long)&(anonymous_namespace)::gx +
                                          (*(ulong **)(this + 8))[1]) + -1);
  }
  local_6c = (*pcVar1)();
  EqMatcher<int>::operator()(&local_48,(EqMatcher<int> *)&local_68,&local_6c);
  std::__cxx11::string::~string((string *)&local_48);
  if (local_48.m_result == true) {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  else {
    local_48.m_message._M_dataplus._M_p = (pointer)&local_48.m_message.field_2;
    local_48.m_message._M_string_length = 0;
    local_48.m_message.field_2._M_local_buf[0] = '\0';
    local_48.m_result = false;
    WhichIs_abi_cxx11_(&local_68,this);
    rhs = AssertionResult::operator<<(&local_48,&local_68);
    AssertionResult::AssertionResult(__return_storage_ptr__,rhs);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( Check(actual) )
        {
            return AssertionSuccess();
        }